

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O1

group * clipp::operator_(group *__return_storage_ptr__,group *a,parameter *b)

{
  _Manager_type p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  __type _Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  group local_1b0;
  parameter local_168;
  group local_68;
  
  if (a->scoped_ == false) {
    bVar3 = group::blocking(a);
    if ((((!bVar3) && (a->exclusive_ == false)) &&
        ((a->super_token<clipp::group>).repeatable_ == false)) && (a->joinable_ == false)) {
      if ((a->super_token<clipp::group>).doc_._M_string_length != 0) {
        _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )a,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)b);
        if (!_Var4) goto LAB_0012c9aa;
      }
      std::
      vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
      ::emplace_back<clipp::parameter>(&a->children_,b);
      bVar3 = false;
      goto LAB_0012cc42;
    }
  }
LAB_0012c9aa:
  local_1b0.super_token<clipp::group>.doc_._M_dataplus._M_p =
       (pointer)&local_1b0.super_token<clipp::group>.doc_.field_2;
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(a->super_token<clipp::group>).doc_._M_dataplus._M_p;
  paVar2 = &(a->super_token<clipp::group>).doc_.field_2;
  if (paVar5 == paVar2) {
    local_1b0.super_token<clipp::group>.doc_.field_2._M_allocated_capacity =
         paVar2->_M_allocated_capacity;
    local_1b0.super_token<clipp::group>.doc_.field_2._8_8_ =
         *(undefined8 *)((long)&(a->super_token<clipp::group>).doc_.field_2 + 8);
  }
  else {
    local_1b0.super_token<clipp::group>.doc_.field_2._M_allocated_capacity =
         paVar2->_M_allocated_capacity;
    local_1b0.super_token<clipp::group>.doc_._M_dataplus._M_p = (pointer)paVar5;
  }
  local_1b0.super_token<clipp::group>.doc_._M_string_length =
       (a->super_token<clipp::group>).doc_._M_string_length;
  (a->super_token<clipp::group>).doc_._M_dataplus._M_p = (pointer)paVar2;
  (a->super_token<clipp::group>).doc_._M_string_length = 0;
  (a->super_token<clipp::group>).doc_.field_2._M_local_buf[0] = '\0';
  local_1b0.super_token<clipp::group>.repeatable_ = (a->super_token<clipp::group>).repeatable_;
  local_1b0.super_token<clipp::group>.blocking_ = (a->super_token<clipp::group>).blocking_;
  local_1b0.children_.
  super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (a->children_).
       super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1b0.children_.
  super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (a->children_).
       super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1b0.children_.
  super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (a->children_).
       super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (a->children_).
  super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (a->children_).
  super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (a->children_).
  super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0.scoped_ = a->scoped_;
  local_1b0.exclusive_ = a->exclusive_;
  local_1b0.joinable_ = a->joinable_;
  local_168.super_token<clipp::parameter>.doc_._M_dataplus._M_p =
       (pointer)&local_168.super_token<clipp::parameter>.doc_.field_2;
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(b->super_token<clipp::parameter>).doc_._M_dataplus._M_p;
  paVar2 = &(b->super_token<clipp::parameter>).doc_.field_2;
  if (paVar5 == paVar2) {
    local_168.super_token<clipp::parameter>.doc_.field_2._M_allocated_capacity =
         paVar2->_M_allocated_capacity;
    local_168.super_token<clipp::parameter>.doc_.field_2._8_8_ =
         *(undefined8 *)((long)&(b->super_token<clipp::parameter>).doc_.field_2 + 8);
  }
  else {
    local_168.super_token<clipp::parameter>.doc_.field_2._M_allocated_capacity =
         paVar2->_M_allocated_capacity;
    local_168.super_token<clipp::parameter>.doc_._M_dataplus._M_p = (pointer)paVar5;
  }
  local_168.super_token<clipp::parameter>.doc_._M_string_length =
       (b->super_token<clipp::parameter>).doc_._M_string_length;
  (b->super_token<clipp::parameter>).doc_._M_dataplus._M_p = (pointer)paVar2;
  (b->super_token<clipp::parameter>).doc_._M_string_length = 0;
  (b->super_token<clipp::parameter>).doc_.field_2._M_local_buf[0] = '\0';
  local_168.super_token<clipp::parameter>.repeatable_ =
       (b->super_token<clipp::parameter>).repeatable_;
  local_168.super_token<clipp::parameter>.blocking_ = (b->super_token<clipp::parameter>).blocking_;
  local_168.super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (b->super_action_provider<clipp::parameter>).argActions_.
       super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_168.super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (b->super_action_provider<clipp::parameter>).argActions_.
       super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_168.super_action_provider<clipp::parameter>.argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (b->super_action_provider<clipp::parameter>).argActions_.
       super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (b->super_action_provider<clipp::parameter>).argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (b->super_action_provider<clipp::parameter>).argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (b->super_action_provider<clipp::parameter>).argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.super_action_provider<clipp::parameter>.repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       (b->super_action_provider<clipp::parameter>).repeatActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_168.super_action_provider<clipp::parameter>.repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (b->super_action_provider<clipp::parameter>).repeatActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_168.super_action_provider<clipp::parameter>.repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (b->super_action_provider<clipp::parameter>).repeatActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (b->super_action_provider<clipp::parameter>).repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (b->super_action_provider<clipp::parameter>).repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (b->super_action_provider<clipp::parameter>).repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.super_action_provider<clipp::parameter>.missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       (b->super_action_provider<clipp::parameter>).missingActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_168.super_action_provider<clipp::parameter>.missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (b->super_action_provider<clipp::parameter>).missingActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_168.super_action_provider<clipp::parameter>.missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (b->super_action_provider<clipp::parameter>).missingActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (b->super_action_provider<clipp::parameter>).missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (b->super_action_provider<clipp::parameter>).missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (b->super_action_provider<clipp::parameter>).missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.super_action_provider<clipp::parameter>.blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       (b->super_action_provider<clipp::parameter>).blockedActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_168.super_action_provider<clipp::parameter>.blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (b->super_action_provider<clipp::parameter>).blockedActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_168.super_action_provider<clipp::parameter>.blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (b->super_action_provider<clipp::parameter>).blockedActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (b->super_action_provider<clipp::parameter>).blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (b->super_action_provider<clipp::parameter>).blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (b->super_action_provider<clipp::parameter>).blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.super_action_provider<clipp::parameter>.conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       (b->super_action_provider<clipp::parameter>).conflictActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_168.super_action_provider<clipp::parameter>.conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (b->super_action_provider<clipp::parameter>).conflictActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_168.super_action_provider<clipp::parameter>.conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (b->super_action_provider<clipp::parameter>).conflictActions_.
       super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (b->super_action_provider<clipp::parameter>).conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (b->super_action_provider<clipp::parameter>).conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (b->super_action_provider<clipp::parameter>).conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.flags_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (b->flags_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_168.flags_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (b->flags_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_168.flags_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (b->flags_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (b->flags_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (b->flags_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (b->flags_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.matcher_.super__Function_base._M_manager = (_Manager_type)0x0;
  local_168.matcher_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_168.matcher_.super__Function_base._M_functor._8_8_ = 0;
  local_168.matcher_._M_invoker = (b->matcher_)._M_invoker;
  p_Var1 = (b->matcher_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_168.matcher_.super__Function_base._M_functor._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(b->matcher_).super__Function_base._M_functor;
    local_168.matcher_.super__Function_base._M_functor._8_8_ =
         *(undefined8 *)((long)&(b->matcher_).super__Function_base._M_functor + 8);
    (b->matcher_).super__Function_base._M_manager = (_Manager_type)0x0;
    (b->matcher_)._M_invoker = (_Invoker_type)0x0;
    local_168.matcher_.super__Function_base._M_manager = p_Var1;
  }
  local_168.label_._M_dataplus._M_p = (pointer)&local_168.label_.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(b->label_)._M_dataplus._M_p;
  paVar5 = &(b->label_).field_2;
  if (paVar2 == paVar5) {
    local_168.label_.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_168.label_.field_2._8_8_ = *(undefined8 *)((long)&(b->label_).field_2 + 8);
  }
  else {
    local_168.label_.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_168.label_._M_dataplus._M_p = (pointer)paVar2;
  }
  local_168.label_._M_string_length = (b->label_)._M_string_length;
  (b->label_)._M_dataplus._M_p = (pointer)paVar5;
  (b->label_)._M_string_length = 0;
  (b->label_).field_2._M_local_buf[0] = '\0';
  local_168.required_ = b->required_;
  local_168.greedy_ = b->greedy_;
  a = &local_68;
  group::group<clipp::parameter>(a,&local_1b0,&local_168);
  local_68.scoped_ = false;
  bVar3 = true;
LAB_0012cc42:
  group::group(__return_storage_ptr__,a);
  if (bVar3) {
    std::
    vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
    ::~vector(&local_68.children_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.super_token<clipp::group>.doc_._M_dataplus._M_p !=
        &local_68.super_token<clipp::group>.doc_.field_2) {
      operator_delete(local_68.super_token<clipp::group>.doc_._M_dataplus._M_p);
    }
    parameter::~parameter(&local_168);
    std::
    vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
    ::~vector(&local_1b0.children_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0.super_token<clipp::group>.doc_._M_dataplus._M_p !=
        &local_1b0.super_token<clipp::group>.doc_.field_2) {
      operator_delete(local_1b0.super_token<clipp::group>.doc_._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline group
operator , (group a, parameter b)
{
    return !a.scoped() && !a.blocking() && !a.exclusive() && !a.repeatable()
        && !a.joinable() && (a.doc().empty() || a.doc() == b.doc())
       ? a.push_back(std::move(b))
       : group{std::move(a), std::move(b)}.scoped(false);
}